

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cset.c
# Opt level: O2

char * cset_openTag(FILE *out,char *line)

{
  int iVar1;
  csafestring_t *obj;
  csafestring_t *obj_00;
  char *pcVar2;
  
  obj = modules_extractVariable(line,"value");
  obj_00 = modules_extractVariable(line,"var");
  if (obj_00 != (csafestring_t *)0x0 && obj != (csafestring_t *)0x0) {
    iVar1 = safe_strncmp(obj,"${",2);
    if (iVar1 == 0) {
      fprintf((FILE *)out,"setVariable(__internal_mfunction, __internal_root, \"%s\",",obj_00->data)
      ;
      expression_eval(out,obj->data,true);
      fwrite(");\n",3,1,(FILE *)out);
    }
    else {
      fprintf((FILE *)out,"setVariable(__internal_mfunction, __internal_root, \"%s\", \"%s\");\n",
              obj_00->data,obj->data);
    }
  }
  safe_destroy(obj);
  safe_destroy(obj_00);
  pcVar2 = modules_findEndOfTag(line);
  return pcVar2 + 1;
}

Assistant:

static char *cset_openTag(FILE *out, char *line) {
	csafestring_t *value = modules_extractVariable(line, "value");
	csafestring_t *var = modules_extractVariable(line, "var");

	if ( value == NULL || var == NULL ) {
		safe_destroy(value);
		safe_destroy(var);
		return modules_findEndOfTag(line) + 1;
	}

	if ( !safe_strncmp(value, "${", 2) ) {
		fprintf(out, "setVariable(__internal_mfunction, __internal_root, \"%s\",", var->data);
		expression_eval(out, value->data, true);
		fprintf(out, ");\n");
	} else {
		fprintf(out, "setVariable(__internal_mfunction, __internal_root, \"%s\", \"%s\");\n", var->data, value->data);
	}

	safe_destroy(value);
	safe_destroy(var);
	return modules_findEndOfTag(line) + 1;
}